

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

char * mp_decode_str(char **data,uint32_t *len)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  
  if (len == (uint32_t *)0x0) {
LAB_0010713a:
    __assert_fail("len != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x821,"const char *mp_decode_str(const char **, uint32_t *)");
  }
  pbVar2 = (byte *)*data;
  bVar1 = *pbVar2;
  pbVar4 = pbVar2 + 1;
  *data = (char *)pbVar4;
  if (bVar1 == 0xdb) {
    uVar3 = *(uint *)(pbVar2 + 1);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    pbVar4 = pbVar2 + 5;
  }
  else if (bVar1 == 0xda) {
    pbVar4 = pbVar2 + 3;
    uVar3 = (uint)(ushort)(*(ushort *)(pbVar2 + 1) << 8 | *(ushort *)(pbVar2 + 1) >> 8);
  }
  else if (bVar1 == 0xd9) {
    uVar3 = (uint)pbVar2[1];
    pbVar4 = pbVar2 + 2;
  }
  else {
    if ((byte)(bVar1 + 0x40) < 0xe0) {
      mp_decode_str_cold_1();
      goto LAB_0010713a;
    }
    uVar3 = bVar1 & 0x1f;
  }
  *len = uVar3;
  *data = (char *)(pbVar4 + uVar3);
  return (char *)pbVar4;
}

Assistant:

MP_IMPL const char *
mp_decode_str(const char **data, uint32_t *len)
{
	assert(len != NULL);

	*len = mp_decode_strl(data);
	const char *str = *data;
	*data += *len;
	return str;
}